

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyErrorsTest::Test3D(CopyErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  deUint32 dVar14;
  RenderContext *pRVar15;
  undefined4 extraout_var;
  bool is_ok;
  Functions *gl;
  CopyErrorsTest *this_local;
  long lVar16;
  
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar13 = (*pRVar15->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar13);
  (**(code **)(lVar16 + 0x78))(0x8d40,this->m_fbo_incomplete);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b51);
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0,0,0,0,4,4);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x506,
                     "glCopyTextureSubImage3D",
                     "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
  (**(code **)(lVar16 + 0x78))(0x8d40,this->m_fbo);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b5e);
  (**(code **)(lVar16 + 0x1218))(0x8ce0);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b61);
  (**(code **)(lVar16 + 0x3a8))(this->m_to_invalid,0,0,0,0,0,0,4,4);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage3D",
                     "texture is not the name of an existing texture object.");
  (**(code **)(lVar16 + 0x3a8))(this->m_to_1D_dst,0,0,0,0,0,0,4,4);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage3D",
                     "the effective target of does not correspond to one of the texture targets supported by the function.."
                    );
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0xffffffff,0,0,0,0,0,4,4);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D","level is less than 0.");
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0xffffffff,0,0,0,0,4,4);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D","xoffset<0.");
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,1,0,0,0,0,4,4);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D",
                     "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified."
                    );
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0xffffffff,0,0,0,4,4);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D","yoffset<0.");
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,1,0,0,0,4,4);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D",
                     "(yoffset+height)>h, where h is the TEXTURE_HEIGHT of the texture image being modified."
                    );
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0,0xffffffff,0,0,4,4);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage3D","zoffset<0.");
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0,5,0,0,4,4);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                      "glCopyTextureSubImage3D",
                      "(zoffset+1)>d, where d is the TEXTURE_DEPTH of the texture image being modified."
                     );
  (**(code **)(lVar16 + 0x1218))(0);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b98);
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0,0,0,0,4,4);
  bVar11 = ErrorsUtilities::CheckErrorAndLog
                     ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                      "glCopyTextureSubImage3D","the read buffer is NONE.");
  (**(code **)(lVar16 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2ba2);
  (**(code **)(lVar16 + 0x1218))(0x8ce0);
  dVar14 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar14,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2ba5);
  (**(code **)(lVar16 + 0x3a8))(this->m_to_3D_dst,0,0,0,0,0,0,4,4);
  bVar12 = ErrorsUtilities::CheckErrorAndLog
                     ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                      "glCopyTextureSubImage3D",
                      "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
  return ((((((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) && bVar8) &&
           bVar9) && bVar10) && bVar11) && bVar12;
}

Assistant:

bool CopyErrorsTest::Test3D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_incomplete);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_FRAMEBUFFER_OPERATION is generated by
	 CopyTextureSubImage3D if the object bound to READ_FRAMEBUFFER_BINDING is
	 not framebuffer complete. */
	{
		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_FRAMEBUFFER_OPERATION, "glCopyTextureSubImage3D",
								  "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
	}

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage3D if
	 texture is not the name of an existing texture object, or if the
	 effective target of texture is not supported by the function. */
	{
		gl.copyTextureSubImage3D(m_to_invalid, 0, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage3D",
								  "texture is not the name of an existing texture object.");

		gl.copyTextureSubImage3D(m_to_1D_dst, 0, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage3D",
			"the effective target of does not correspond to one of the texture targets supported by the function..");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage3D if level is less than 0. */
	{
		gl.copyTextureSubImage3D(m_to_3D_dst, -1, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D", "level is less than 0.");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage3D if
	 xoffset<0, (xoffset+width)>w, yoffset<0, (yoffset+height)>h, zoffset<0,
	 or (zoffset+1)>d, where w is the TEXTURE_WIDTH, h is the TEXTURE_HEIGHT,
	 d is the TEXTURE_DEPTH and of the texture image being modified. Note
	 that w, h, and d include twice the border width.  */
	{
		gl.copyTextureSubImage3D(m_to_3D_dst, 0, -1, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D", "xoffset<0.");

		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 1, 0, 0, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D",
							 "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified.");

		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, -1, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D", "yoffset<0.");

		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 1, 0, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D",
							 "(yoffset+height)>h, where h is the TEXTURE_HEIGHT of the texture image being modified.");

		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 0, -1, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D", "zoffset<0.");

		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 0, s_depth + 1, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage3D",
								  "(zoffset+1)>d, where d is the TEXTURE_DEPTH of the texture image being modified.");
	}

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage3D if
	 the read buffer is NONE. */
	gl.readBuffer(GL_NONE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	{
		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage3D", "the read buffer is NONE.");
	}

	/* Bind multisample framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage3D if
	 the effective value of SAMPLE_BUFFERS for the read
	 framebuffer is one. */
	{
		gl.copyTextureSubImage3D(m_to_3D_dst, 0, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage3D",
								  "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
	}

	return is_ok;
}